

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshotDiff.cpp
# Opt level: O0

bool __thiscall efsw::DirectorySnapshotDiff::changed(DirectorySnapshotDiff *this)

{
  bool bVar1;
  byte local_11;
  DirectorySnapshotDiff *this_local;
  
  bVar1 = std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::empty
                    (&this->FilesCreated);
  local_11 = 1;
  if (bVar1) {
    bVar1 = std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::empty
                      (&this->FilesModified);
    local_11 = 1;
    if (bVar1) {
      bVar1 = std::__cxx11::
              list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::empty(&this->FilesMoved);
      local_11 = 1;
      if (bVar1) {
        bVar1 = std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::empty
                          (&this->FilesDeleted);
        local_11 = 1;
        if (bVar1) {
          bVar1 = std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::empty
                            (&this->DirsCreated);
          local_11 = 1;
          if (bVar1) {
            bVar1 = std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::empty
                              (&this->DirsModified);
            local_11 = 1;
            if (bVar1) {
              bVar1 = std::__cxx11::
                      list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                      ::empty(&this->DirsMoved);
              local_11 = 1;
              if (bVar1) {
                bVar1 = std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::empty
                                  (&this->DirsDeleted);
                local_11 = bVar1 ^ 0xff;
              }
            }
          }
        }
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool DirectorySnapshotDiff::changed()
{
	return	!FilesCreated.empty()	||
			!FilesModified.empty()	||
			!FilesMoved.empty()		||
			!FilesDeleted.empty()	||
			!DirsCreated.empty()	||
			!DirsModified.empty()	||
			!DirsMoved.empty()		||
			!DirsDeleted.empty();
}